

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repl.h
# Opt level: O0

void __thiscall repl::repl(repl *this)

{
  anon_class_1_0_00000001_for_m_object *in_RCX;
  undefined1 local_112 [2];
  string local_110 [32];
  handler_id_type local_f0;
  repl *local_c8;
  allocator<char> local_b9;
  string local_b8 [32];
  handler_id_type local_98;
  undefined1 local_6d [21];
  string local_58 [32];
  handler_id_type local_38;
  repl *local_10;
  repl *this_local;
  
  this->m_active = true;
  this->m_step = 0;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"help",(allocator<char> *)(local_6d + 0x14));
  handlebars::
  dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::connect<repl::repl()::_lambda(auto:1)_1_>
            (&local_38,
             (dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d,
             (anon_class_1_0_00000001_for_m_object *)in_RCX);
  handlebars::
  dispatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::handler_id_type::~handler_id_type(&local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)(local_6d + 0x14));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"quit",&local_b9);
  local_c8 = this;
  handlebars::
  dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::connect<repl::repl()::_lambda(auto:1)_2_>
            (&local_98,
             (dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)local_b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8,
             (anon_class_8_1_8991fb9c_for_m_object *)in_RCX);
  handlebars::
  dispatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::handler_id_type::~handler_id_type(&local_98);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_110,"echo",(allocator<char> *)(local_112 + 1));
  handlebars::
  dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::connect<repl::repl()::_lambda(auto:1)_3_>
            (&local_f0,
             (dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)local_110,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_112,in_RCX);
  handlebars::
  dispatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::handler_id_type::~handler_id_type(&local_f0);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)(local_112 + 1));
  return;
}

Assistant:

repl()
    : m_step(0)
    , m_active(true)
  {
    events::connect("help", [](auto argv) { 
		std::cout << "valid commands: help quit echo\n";
	});
    events::connect("quit", [this](auto argv) { this->m_active = false; });
    events::connect("echo", [](auto argv) {
      for (auto t = argv.begin() + 1; t != argv.end(); ++t) {
        std::cout << *t << '\n';
      }
    });
  }